

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O3

MOJOSHADER_irExpression *
build_ir_derefstruct(Context_conflict *ctx,MOJOSHADER_astExpressionDerefStruct *ast)

{
  int iVar1;
  MOJOSHADER_astDataType *dt;
  MOJOSHADER_astDataType *pMVar2;
  MOJOSHADER_irExpression *pMVar3;
  MOJOSHADER_irNodeType MVar4;
  MOJOSHADER_irExpression *pMVar5;
  MOJOSHADER_astDataTypeType MVar6;
  
  dt = reduce_datatype(ctx,ast->datatype);
  pMVar2 = reduce_datatype(ctx,dt);
  MVar6 = pMVar2->type;
  if (MVar6 - MOJOSHADER_AST_DATATYPE_ARRAY < 4) {
    MVar6 = ((pMVar2->array).base)->type;
  }
  iVar1 = datatype_elems(ctx,dt);
  pMVar3 = (MOJOSHADER_irExpression *)build_ir(ctx,ast->identifier);
  if (pMVar3 != (MOJOSHADER_irExpression *)0x0) {
    MVar4 = (pMVar3->ir).type;
    if (MVar4 == MOJOSHADER_IR_START_RANGE_EXPR) {
      __assert_fail("!retval || (retval->ir.type > MOJOSHADER_IR_START_RANGE_EXPR)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x11ec,"MOJOSHADER_irExpression *build_ir_expr(Context *, void *)");
    }
    if (MOJOSHADER_IR_CONSTRUCT < MVar4) {
      __assert_fail("!retval || (retval->ir.type < MOJOSHADER_IR_END_RANGE_EXPR)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x11ed,"MOJOSHADER_irExpression *build_ir_expr(Context *, void *)");
    }
    pMVar5 = pMVar3;
    if (ast->isswizzle != 0) {
      __assert_fail("!ast->isswizzle",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x14d4,
                    "MOJOSHADER_irExpression *build_ir_derefstruct(Context *, const MOJOSHADER_astExpressionDerefStruct *)"
                   );
    }
    while (MVar4 == MOJOSHADER_IR_ESEQ) {
      MVar4 = ((MOJOSHADER_irNodeInfo *)&(((MOJOSHADER_irExpression *)(pMVar5->call).args)->ir).type
              )->type;
      pMVar5 = (MOJOSHADER_irExpression *)(pMVar5->call).args;
    }
    if ((MVar4 != MOJOSHADER_IR_TEMP) && (MVar4 != MOJOSHADER_IR_MEMORY)) {
      __assert_fail("0 && \"Unexpected condition\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x14de,
                    "MOJOSHADER_irExpression *build_ir_derefstruct(Context *, const MOJOSHADER_astExpressionDerefStruct *)"
                   );
    }
    (pMVar5->temp).index = (pMVar5->temp).index + ast->member_index;
    (pMVar3->info).type = MVar6;
    (pMVar3->info).elements = iVar1;
  }
  return pMVar3;
}

Assistant:

static MOJOSHADER_irExpression *build_ir_derefstruct(Context *ctx, const MOJOSHADER_astExpressionDerefStruct *ast)
{
    // There are only three possible IR nodes that contain a struct:
    //  an irTemp, an irMemory, or an irESeq that results in a temp or memory.
    //  As such, we figure out which it is, and offset appropriately for the
    //  member.
    const MOJOSHADER_astDataType *dt = reduce_datatype(ctx, ast->datatype);
    const MOJOSHADER_astDataTypeType type = datatype_base(ctx, dt)->type;
    const int elems = datatype_elems(ctx, dt);
    MOJOSHADER_irExpression *expr = build_ir_expr(ctx, ast->identifier);
    MOJOSHADER_irExpression *finalexpr = expr;

    if (expr == NULL)
        return NULL;

    assert(!ast->isswizzle);

    while (finalexpr->ir.type == MOJOSHADER_IR_ESEQ)
        finalexpr = finalexpr->eseq.expr;

    if (finalexpr->ir.type == MOJOSHADER_IR_TEMP)
        finalexpr->temp.index += ast->member_index;
    else if (finalexpr->ir.type == MOJOSHADER_IR_MEMORY)
        finalexpr->memory.index += ast->member_index;
    else
        assert(0 && "Unexpected condition");

    // Replace the struct type with the type of the member.
    expr->info.type = type;
    expr->info.elements = elems;

    return expr;
}